

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontAtlas::~ImFontAtlas(ImFontAtlas *this)

{
  ImFontConfig *ptr;
  ImFontAtlasCustomRect *ptr_00;
  ImFont **ptr_01;
  
  if (this->Locked != true) {
    ClearInputData(this);
    ClearTexData(this);
    ClearFonts(this);
    ptr = (this->ConfigData).Data;
    if (ptr != (ImFontConfig *)0x0) {
      ImGui::MemFree(ptr);
    }
    ptr_00 = (this->CustomRects).Data;
    if (ptr_00 != (ImFontAtlasCustomRect *)0x0) {
      ImGui::MemFree(ptr_00);
    }
    ptr_01 = (this->Fonts).Data;
    if (ptr_01 != (ImFont **)0x0) {
      ImGui::MemFree(ptr_01);
    }
    return;
  }
  __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                ,0x7bf,"ImFontAtlas::~ImFontAtlas()");
}

Assistant:

ImFontAtlas::~ImFontAtlas()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    Clear();
}